

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::drawFrameDecoration
          (QTextDocumentLayoutPrivate *this,QPainter *painter,QTextFrame *frame,QTextFrameData *fd,
          QRectF *clip,QRectF *rect)

{
  bool bVar1;
  int iVar2;
  long in_RCX;
  QPainter *in_RSI;
  qreal *in_R8;
  QRectF *in_R9;
  long in_FS_OFFSET;
  QTextFrameFormat *this_00;
  qreal qVar3;
  double aleft;
  QPainter *this_01;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  double dVar9;
  QTextFrame *pQVar10;
  QPointF QVar11;
  qreal h;
  qreal w;
  qreal rightMargin;
  qreal bottomMargin;
  qreal leftMargin;
  qreal topMargin;
  qreal border;
  qreal leftEdge;
  QPointF origin;
  QRectF gradientRect;
  QRectF bgRect;
  QBrush bg;
  QTextFormat *in_stack_fffffffffffffe48;
  QTextFrame *in_stack_fffffffffffffe50;
  QRectF *in_stack_fffffffffffffe58;
  QPointF *in_stack_fffffffffffffe60;
  QBrush *in_stack_fffffffffffffe68;
  QRectF *in_stack_fffffffffffffe70;
  QPainter *in_stack_fffffffffffffe78;
  PenStyle style;
  BorderStyle in_stack_ffffffffffffff14;
  QBrush *in_stack_ffffffffffffff18;
  qreal in_stack_ffffffffffffff20;
  qreal in_stack_ffffffffffffff28;
  qreal in_stack_ffffffffffffff30;
  QFixed in_stack_ffffffffffffff38;
  QFixed lhs;
  QPainter *in_stack_ffffffffffffff40;
  QTextDocumentLayoutPrivate *in_stack_ffffffffffffff48;
  QRectF local_a8;
  undefined4 local_88;
  QFixed local_84;
  undefined4 local_80;
  QFixed local_7c;
  undefined4 local_78;
  QFixed local_74;
  undefined4 local_70;
  QFixed local_6c;
  QRectF local_68;
  undefined4 local_44;
  undefined1 *local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::frameFormat((QTextFrame *)in_stack_fffffffffffffe60);
  QTextFormat::background(in_stack_fffffffffffffe48);
  QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7f9b3f);
  local_44 = 0;
  bVar1 = ::operator!=((QBrush *)in_stack_fffffffffffffe50,(BrushStyle *)in_stack_fffffffffffffe48);
  if (bVar1) {
    local_68.xp = in_R9->xp;
    local_68.yp = in_R9->yp;
    local_68.w = in_R9->w;
    local_68.h = in_R9->h;
    local_70 = *(undefined4 *)(in_RCX + 0x28);
    local_6c = QFixed::operator+((QFixed *)in_stack_fffffffffffffe48,(int)in_stack_fffffffffffffe50)
    ;
    qVar3 = QFixed::toReal(&local_6c);
    local_78 = *(undefined4 *)(in_RCX + 0x28);
    local_74 = QFixed::operator+((QFixed *)in_stack_fffffffffffffe48,(int)in_stack_fffffffffffffe50)
    ;
    qVar4 = QFixed::toReal(&local_74);
    local_80 = *(undefined4 *)(in_RCX + 0x28);
    local_7c = QFixed::operator+((QFixed *)in_stack_fffffffffffffe48,(int)in_stack_fffffffffffffe50)
    ;
    qVar5 = QFixed::toReal(&local_7c);
    local_88 = *(undefined4 *)(in_RCX + 0x28);
    local_84 = QFixed::operator+((QFixed *)in_stack_fffffffffffffe48,(int)in_stack_fffffffffffffe50)
    ;
    qVar6 = QFixed::toReal(&local_84);
    QRectF::adjust(&local_68,qVar3,qVar4,-qVar5,-qVar6);
    local_a8.xp = -NAN;
    local_a8.yp = -NAN;
    local_a8.w = -NAN;
    local_a8.h = -NAN;
    QRectF::QRectF(&local_a8);
    QVar11 = QRectF::topLeft(in_stack_fffffffffffffe58);
    in_stack_ffffffffffffff48 = (QTextDocumentLayoutPrivate *)QVar11.xp;
    pQVar10 = QTextFrame::parentFrame(in_stack_fffffffffffffe50);
    if (pQVar10 == (QTextFrame *)0x0) {
      local_68.xp = *in_R8;
      local_68.yp = in_R8[1];
      local_68.w = in_R8[2];
      local_68.h = in_R8[3];
      QPainter::device((QPainter *)in_stack_fffffffffffffe58);
      iVar2 = QPaintDevice::width((QPaintDevice *)0x7f9e1e);
      QRectF::setWidth(&local_a8,(double)iVar2);
      QPainter::device((QPainter *)in_stack_fffffffffffffe58);
      iVar2 = QPaintDevice::height((QPaintDevice *)0x7f9e44);
      QRectF::setHeight(&local_a8,(double)iVar2);
    }
    QBrush::QBrush((QBrush *)in_stack_fffffffffffffe50,(QBrush *)in_stack_fffffffffffffe48);
    fillBackground(in_RSI,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QBrush::~QBrush((QBrush *)0x7f9eae);
    in_stack_fffffffffffffe78 = in_RSI;
  }
  lhs.val = *(int *)(in_RCX + 0x28);
  QFixed::QFixed((QFixed *)&stack0xffffffffffffff38,0);
  bVar1 = ::operator!=(lhs,in_stack_ffffffffffffff38);
  if (bVar1) {
    QPainter::save(in_stack_fffffffffffffe78);
    style = (PenStyle)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    QPainter::setBrush((QPainter *)in_stack_fffffffffffffe58,
                       (GlobalColor)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    QPainter::setPen((QPainter *)in_stack_fffffffffffffe50,style);
    this_00 = (QTextFrameFormat *)QRectF::left(in_R9);
    qVar3 = QFixed::toReal((QFixed *)(in_RCX + 0x20));
    aleft = (double)this_00 + qVar3;
    qVar3 = QFixed::toReal((QFixed *)(in_RCX + 0x28));
    this_01 = (QPainter *)QFixed::toReal((QFixed *)(in_RCX + 0x18));
    qVar4 = QFixed::toReal((QFixed *)(in_RCX + 0x20));
    qVar5 = QFixed::toReal((QFixed *)(in_RCX + 0x1c));
    qVar6 = QFixed::toReal((QFixed *)(in_RCX + 0x24));
    qVar7 = QRectF::width(in_R9);
    qVar8 = QRectF::height(in_R9);
    dVar9 = (qVar8 - (qVar3 + qVar3)) - (double)this_01;
    qVar8 = QRectF::top(in_R9);
    QRectF::QRectF((QRectF *)&stack0xffffffffffffff18,aleft,qVar8 + (double)this_01,
                   (((qVar7 - (qVar3 + qVar3)) - qVar4) - qVar6) + qVar3,(dVar9 - qVar5) + qVar3);
    pQVar10 = (QTextFrame *)QFixed::toReal((QFixed *)(in_RCX + 0x3c));
    QFixed::toReal((QFixed *)(in_RCX + 0x40));
    QTextFrame::frameFormat(pQVar10);
    QTextFrameFormat::borderBrush(this_00);
    QTextFrame::frameFormat(pQVar10);
    QTextFrameFormat::borderStyle((QTextFrameFormat *)0x7fa11c);
    drawBorder(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (QRectF *)CONCAT44(lhs.val,in_stack_ffffffffffffff38.val),in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff14);
    QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7fa15d);
    QBrush::~QBrush((QBrush *)0x7fa16a);
    QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7fa177);
    QPainter::restore(this_01);
  }
  QBrush::~QBrush((QBrush *)0x7fa191);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawFrameDecoration(QPainter *painter, QTextFrame *frame, QTextFrameData *fd, const QRectF &clip, const QRectF &rect) const
{

    const QBrush bg = frame->frameFormat().background();
    if (bg != Qt::NoBrush) {
        QRectF bgRect = rect;
        bgRect.adjust((fd->leftMargin + fd->border).toReal(),
                      (fd->topMargin + fd->border).toReal(),
                      - (fd->rightMargin + fd->border).toReal(),
                      - (fd->bottomMargin + fd->border).toReal());

        QRectF gradientRect; // invalid makes it default to bgRect
        QPointF origin = bgRect.topLeft();
        if (!frame->parentFrame()) {
            bgRect = clip;
            gradientRect.setWidth(painter->device()->width());
            gradientRect.setHeight(painter->device()->height());
        }
        fillBackground(painter, bgRect, bg, origin, gradientRect);
    }
    if (fd->border != 0) {
        painter->save();
        painter->setBrush(Qt::lightGray);
        painter->setPen(Qt::NoPen);

        const qreal leftEdge = rect.left() + fd->leftMargin.toReal();
        const qreal border = fd->border.toReal();
        const qreal topMargin = fd->topMargin.toReal();
        const qreal leftMargin = fd->leftMargin.toReal();
        const qreal bottomMargin = fd->bottomMargin.toReal();
        const qreal rightMargin = fd->rightMargin.toReal();
        const qreal w = rect.width() - 2 * border - leftMargin - rightMargin;
        const qreal h = rect.height() - 2 * border - topMargin - bottomMargin;

        drawBorder(painter, QRectF(leftEdge, rect.top() + topMargin, w + border, h + border),
                   fd->effectiveTopMargin.toReal(), fd->effectiveBottomMargin.toReal(),
                   border, frame->frameFormat().borderBrush(), frame->frameFormat().borderStyle());

        painter->restore();
    }
}